

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseGraph.cpp
# Opt level: O0

void PrintEnterBlock(ParseGraphContext *ctx,char *name)

{
  char *name_local;
  ParseGraphContext *ctx_local;
  
  PrintIndent(ctx);
  if (*name != '\0') {
    OutputContext::Print(ctx->output,name);
    OutputContext::Print(ctx->output,": ");
  }
  OutputContext::Print(ctx->output,"{\n");
  ctx->depth = ctx->depth + 1;
  return;
}

Assistant:

void PrintEnterBlock(ParseGraphContext &ctx, const char *name)
{
	PrintIndent(ctx);

	if(*name)
	{
		ctx.output.Print(name);
		ctx.output.Print(": ");
	}

	ctx.output.Print("{\n");

	ctx.depth++;
}